

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::WriteBricks(brick_pool *Bp,cstr FileName)

{
  uint uVar1;
  stack_array<idx2::v3<int>,_16> *psVar2;
  error<idx2::idx2_err_code> eVar3;
  error<idx2::err_code> eVar4;
  v3<int> Var;
  v3<int> Var_00;
  v3<int> Var_01;
  v3<int> Var_02;
  v3<int> Var_03;
  undefined2 local_450;
  bool bStack_44e;
  anon_class_1_0_00000001 local_445;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 local_424;
  error<idx2::err_code> local_420;
  grid local_410;
  undefined8 local_3f8;
  int local_3f0;
  undefined8 local_3e4;
  v3i F3;
  v3i D3;
  brick_volume BrickVol;
  undefined1 local_304 [8];
  v3i B3;
  undefined2 local_290;
  bool bStack_28e;
  anon_class_1_0_00000001 local_271;
  undefined1 local_270 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2SparseBricks_cpp:209:3)>
  __ScopeGuard__209;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__209;
  FILE *Fp;
  cstr FileName_local;
  brick_pool *Bp_local;
  undefined2 local_238;
  undefined1 uStack_236;
  undefined5 uStack_235;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  dtype *local_d8;
  grid *local_d0;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined8 local_b0;
  int local_a8;
  undefined8 local_98;
  int local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  undefined8 local_78;
  int local_70;
  undefined8 local_60;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_40;
  uint local_38;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_28;
  uint local_1c;
  int local_18;
  int local_14;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_10;
  
  __CleanUpFunc__209.Fp = (FILE **)fopen(FileName,"wb");
  __ScopeGuard__209._8_8_ = &__CleanUpFunc__209;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp:209:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2SparseBricks_cpp:209:3)>
                 *)local_270,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__209.Dismissed);
  if (__CleanUpFunc__209.Fp == (FILE **)0x0) {
    eVar3 = WriteBricks::anon_class_1_0_00000001::operator()(&local_271);
    Bp_local = (brick_pool *)eVar3.Msg;
    local_290 = eVar3._8_2_;
    local_238 = local_290;
    bStack_28e = eVar3.StrGened;
    uStack_236 = bStack_28e;
  }
  else {
    uVar1 = (Bp->Idx2->Dims3).field_0.field_0.Z;
    Var.field_0.field_0.Y = 0;
    Var.field_0.field_0.X = uVar1;
    Var.field_0.field_0.Z = uVar1;
    WritePOD<idx2::v3<int>>
              ((idx2 *)__CleanUpFunc__209.Fp,(FILE *)(Bp->Idx2->Dims3).field_0.field_3.XY.field_0,
               Var);
    uVar1 = (Bp->Idx2->BrickDims3).field_0.field_0.Z;
    Var_00.field_0.field_0.Y = 0;
    Var_00.field_0.field_0.X = uVar1;
    Var_00.field_0.field_0.Z = uVar1;
    WritePOD<idx2::v3<int>>
              ((idx2 *)__CleanUpFunc__209.Fp,
               (FILE *)(Bp->Idx2->BrickDims3).field_0.field_3.XY.field_0,Var_00);
    uVar1 = (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z;
    B3.field_0.field_4.YZ.field_0 = (v2<int>)*(undefined8 *)&(Bp->Idx2->NBricks3).Arr[0].field_0;
    Var_01.field_0.field_0.Y = 0;
    Var_01.field_0.field_0.X = uVar1;
    Var_01.field_0.field_0.Z = uVar1;
    WritePOD<idx2::v3<int>>
              ((idx2 *)__CleanUpFunc__209.Fp,(FILE *)B3.field_0.field_4.YZ.field_0,Var_01);
    eVar4.Code = local_420.Code;
    eVar4.StackIdx = local_420.StackIdx;
    eVar4.StrGened = local_420.StrGened;
    eVar4._14_2_ = local_420._14_2_;
    eVar4.Msg = local_420.Msg;
    for (B3.field_0.field_0.X = 0;
        B3.field_0.field_0.X < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z;
        B3.field_0.field_0.X = B3.field_0.field_0.X + 1) {
      for (local_304._4_4_ = 0; (int)local_304._4_4_ < (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Y
          ; local_304._4_4_ = local_304._4_4_ + 1) {
        for (local_304._0_4_ = 0; psVar2 = &Bp->Idx2->NBricks3,
            (int)local_304._0_4_ < psVar2->Arr[0].field_0.field_0.X;
            local_304._0_4_ = local_304._0_4_ + 1) {
          BrickVol._56_8_ = CONCAT44(local_304._4_4_,local_304._0_4_);
          Var_02.field_0.field_0.Y = 0;
          Var_02.field_0.field_0.X = B3.field_0.field_0.X;
          Var_02.field_0._8_4_ = SUB84(psVar2,0);
          local_420 = eVar4;
          WritePOD<idx2::v3<int>>((idx2 *)__CleanUpFunc__209.Fp,(FILE *)BrickVol._56_8_,Var_02);
          GetBrickVolume((brick_volume *)((long)&D3.field_0.field_4.YZ.field_0 + 4),Bp,
                         (v3i *)local_304);
          local_4c = ((int)BrickVol.ExtentLocal.From << 0xb) >> 0xb;
          local_48 = &local_60;
          local_50 = (int)((long)(BrickVol.ExtentLocal.From << 0x16) >> 0x2b);
          D3.field_0.field_0.X = (int)((long)(BrickVol.ExtentLocal.From * 2) >> 0x2b);
          local_60._0_4_ = local_4c;
          local_60._4_4_ = local_50;
          local_78 = local_60;
          local_14 = ((int)BrickVol.ExtentLocal.From << 0xb) >> 0xb;
          local_10 = &local_28;
          local_18 = (int)((long)(BrickVol.ExtentLocal.From << 0x16) >> 0x2b);
          local_38 = (uint)((long)(BrickVol.ExtentLocal.From * 2) >> 0x2b);
          local_28.field_0.X = local_14;
          local_28.field_0.Y = local_18;
          local_40.field_0 = local_28.field_0;
          F3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)local_28;
          Var_03.field_0.field_0.Y = 0;
          Var_03.field_0.field_0.X = local_38;
          Var_03.field_0._8_4_ = local_28.field_0.X;
          local_70 = D3.field_0.field_0.X;
          local_54 = D3.field_0.field_0.X;
          local_1c = local_38;
          WritePOD<idx2::v3<int>>((idx2 *)__CleanUpFunc__209.Fp,(FILE *)local_28,Var_03);
          local_84 = (BrickVol.Vol._32_4_ << 0xb) >> 0xb;
          local_80 = &local_98;
          local_88 = (int)((long)(BrickVol.Vol._32_8_ << 0x16) >> 0x2b);
          local_3f0 = (int)(BrickVol.Vol._32_8_ * 2 >> 0x2b);
          local_98._0_4_ = local_84;
          local_98._4_4_ = local_88;
          local_b0 = local_98;
          local_3f8 = local_98;
          local_3e4 = local_98;
          local_d8 = &BrickVol.Vol.Type;
          local_d0 = &local_410;
          local_410.super_extent.From = BrickVol.Vol._32_8_;
          local_410.super_extent.Dims = BrickVol.ExtentLocal.From;
          local_c0 = &local_e4;
          local_c4 = 1;
          local_e4 = 1;
          local_e0 = 1;
          local_dc = 1;
          local_b8 = &local_e4;
          local_410.Strd = 0x40000200001;
          F3.field_0.field_0.X = local_3f0;
          local_a8 = local_3f0;
          local_8c = local_3f0;
          eVar4 = WriteVolume((FILE *)__CleanUpFunc__209.Fp,
                              (volume *)((long)&D3.field_0.field_4.YZ.field_0 + 4),&local_410);
          local_42c = 1;
          local_428 = 1;
          local_424 = 1;
        }
        local_438 = 1;
        local_434 = 1;
        local_430 = 1;
      }
      local_444 = 1;
      local_440 = 1;
      local_43c = 1;
    }
    local_420 = eVar4;
    eVar3 = WriteBricks::anon_class_1_0_00000001::operator()(&local_445);
    Bp_local = (brick_pool *)eVar3.Msg;
    local_450 = eVar3._8_2_;
    local_238 = local_450;
    bStack_44e = eVar3.StrGened;
    uStack_236 = bStack_44e;
  }
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp:209:3)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2SparseBricks_cpp:209:3)>
                  *)local_270);
  eVar3.Code = (undefined1)local_238;
  eVar3.StackIdx = local_238._1_1_;
  eVar3.Msg = (cstr)Bp_local;
  eVar3.StrGened = (bool)uStack_236;
  eVar3._11_5_ = uStack_235;
  return eVar3;
}

Assistant:

error<idx2_err_code>
WriteBricks(brick_pool* Bp, cstr FileName)
{
  idx2_RAII(FILE*, Fp = fopen(FileName, "wb"), , if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(idx2_err_code::FileCreateFailed);

  WritePOD(Fp, Bp->Idx2->Dims3);
  WritePOD(Fp, Bp->Idx2->BrickDims3);
  WritePOD(Fp, Bp->Idx2->NBricks3[0]);

  v3i B3;
  idx2_BeginFor3 (B3, v3i(0), Bp->Idx2->NBricks3[0], v3i(1))
  {
    //u64 BrickIndex = GetLinearBrick(*Bp->Idx2, 0, B3);
    WritePOD(Fp, B3);
    brick_volume BrickVol = GetBrickVolume(Bp, B3);
    v3i D3 = Dims(BrickVol.ExtentLocal);
    WritePOD(Fp, Dims(BrickVol.ExtentLocal));
    v3i F3 = From(BrickVol.ExtentLocal);
    WriteVolume(Fp, BrickVol.Vol, grid(BrickVol.ExtentLocal));
  } idx2_EndFor3

  return idx2_Error(idx2_err_code::NoError);
}